

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdlbackend.h
# Opt level: O1

void __thiscall rengine::SDLBackend::requestRender(SDLBackend *this)

{
  undefined4 local_40 [3];
  undefined4 local_34;
  SDL_GLContext *local_30;
  undefined8 local_28;
  
  if (*(char *)&this->m_window == '\0') {
    *(undefined1 *)&this->m_window = 1;
    local_30 = &this[-1].m_gl;
    local_40[0] = 0x8000;
    local_34 = 0;
    local_28 = 0;
    SDL_PushEvent(local_40);
  }
  return;
}

Assistant:

inline void SDLBackend::requestRender() {
    if (m_renderRequested)
        return;
    m_renderRequested = true;
    // we can't trigger the render synchronously. we need to give a chance
    // to process input, animations, whatever -- so push an event onto the
    // queue and we'll get back to this later.
    SDL_Event event;

    SDL_UserEvent renderev;
    renderev.type = SDL_USEREVENT;
    renderev.code = 0;
    renderev.data1 = this;
    renderev.data2 = NULL;

    event.type = SDL_USEREVENT;
    event.user = renderev;

    SDL_PushEvent(&event);
}